

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O0

TimeStamp Js::Profiler::GetFrequency(void)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  LARGE_INTEGER local_18;
  LARGE_INTEGER tmp;
  
  BVar3 = QueryPerformanceFrequency(&local_18);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileInstrument.cpp"
                                ,0x1f8,"(0)","Could not get time. Don\'t know what to do");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    tmp.QuadPart = 0;
  }
  else {
    tmp.QuadPart = local_18.QuadPart / 1000;
  }
  return tmp.QuadPart;
}

Assistant:

TimeStamp
    Profiler::GetFrequency()
    {
#if !defined HIRES_PROFILER && (defined(_M_IX86) || defined(_M_X64))
        long long start, end;
        int CPUInfo[4];

        // Flush pipeline
        __cpuid(CPUInfo, 0);

        // Measure 1 second / 5
        start = GetTime();
        Sleep(1000/5);
        end = GetTime();

        return  ((end - start) * 5) / FrequencyScale;
#else
        LARGE_INTEGER tmp;
        if(QueryPerformanceFrequency(&tmp))
        {
            return tmp.QuadPart / FrequencyScale;
        }
        else
        {
            AssertMsg(0, "Could not get time. Don't know what to do");
            return 0;
        }
#endif
    }